

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void TCLAP::ClearContainer<std::__cxx11::list<TCLAP::Visitor*,std::allocator<TCLAP::Visitor*>>>
               (list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *c)

{
  iterator this;
  _List_iterator<TCLAP::Visitor_*> in_RDI;
  _List_iterator<TCLAP::Visitor_*> unaff_retaddr;
  list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *in_stack_ffffffffffffffe8;
  
  this = std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::begin
                   (in_stack_ffffffffffffffe8);
  std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::end
            (in_stack_ffffffffffffffe8);
  __std__for_each<std::_List_iterator<TCLAP::Visitor*>,void(*)(TCLAP::Visitor*)>_std___List_iterator<TCLAP::Visitor*>_std___List_iterator<TCLAP::Visitor*>_void____TCLAP__Visitor____
            (unaff_retaddr,in_RDI,(_func_void_Visitor_ptr *)this._M_node);
  std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::clear
            ((list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *)this._M_node);
  return;
}

Assistant:

void ClearContainer(C &c)
{
	typedef typename C::value_type value_type;
	std::for_each(c.begin(), c.end(), DelPtr<value_type>);
	c.clear();
}